

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O0

void XPMP2::XPMPSendNotification(Aircraft *plane,XPMPPlaneNotification _notification)

{
  bool bVar1;
  XPMPPlaneID XVar2;
  reference pXVar3;
  XPMPPlaneNotification in_ESI;
  Aircraft *in_RDI;
  XPMPPlaneNotifierTy *n;
  iterator __end1;
  iterator __begin1;
  listXPMPPlaneNotifierTy *__range1;
  list<XPMP2::XPMPPlaneNotifierTy,_std::allocator<XPMP2::XPMPPlaneNotifierTy>_>
  *in_stack_ffffffffffffffc8;
  XPMPPlaneNotifier_f p_Var4;
  _Self local_28;
  _Self local_20;
  undefined *local_18;
  XPMPPlaneNotification local_c;
  Aircraft *local_8;
  
  local_18 = &DAT_0047dad0;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<XPMP2::XPMPPlaneNotifierTy,_std::allocator<XPMP2::XPMPPlaneNotifierTy>_>::
       begin(in_stack_ffffffffffffffc8);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<XPMP2::XPMPPlaneNotifierTy,_std::allocator<XPMP2::XPMPPlaneNotifierTy>_>::
       end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    pXVar3 = std::_List_iterator<XPMP2::XPMPPlaneNotifierTy>::operator*
                       ((_List_iterator<XPMP2::XPMPPlaneNotifierTy> *)0x377e2e);
    p_Var4 = pXVar3->func;
    XVar2 = Aircraft::GetModeS_ID(local_8);
    (*p_Var4)(XVar2,local_c,pXVar3->refcon);
    std::_List_iterator<XPMP2::XPMPPlaneNotifierTy>::operator++(&local_20);
  }
  return;
}

Assistant:

void XPMPSendNotification (const Aircraft& plane, XPMPPlaneNotification _notification)
{
    for (const XPMPPlaneNotifierTy& n: glob.listObservers)
        n.func(plane.GetModeS_ID(),
               _notification,
               n.refcon);
}